

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O0

void close_report(FILE *out)

{
  uint local_18;
  uint local_14;
  int numwrns;
  int numerrs;
  FILE *out_local;
  
  local_14 = 0;
  local_18 = 0;
  _numwrns = out;
  if (prstat != 0) {
    hdus_summary(out);
  }
  total_errors((int *)&local_14,(int *)&local_18);
  total_warn = local_18;
  total_err = local_14;
  sprintf(comm,"**** Verification found %d warning(s) and %d error(s). ****",(ulong)local_18,
          (ulong)local_14);
  wrtout(_numwrns,comm);
  update_parfile(local_14,local_18);
  destroy_hduname();
  return;
}

Assistant:

void close_report(FILE *out              /* output file */ )
{
    int numerrs = 0;                    /* number of the errors         */
    int numwrns = 0;                    /* number of the warnings       */

    /* print out a summary of all the hdus */
    if(prstat)hdus_summary(out);
    total_errors (&numerrs, &numwrns);

    total_warn = numwrns;
    total_err  = numerrs;

    /* get the total number of errors and warnnings */
    sprintf(comm,"**** Verification found %d warning(s) and %d error(s). ****",
              numwrns, numerrs);
    wrtout(out,comm);

    update_parfile(numerrs,numwrns);
    /* destroy the hdu name */
    destroy_hduname();
    return ;
}